

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

CAmount __thiscall
wallet::anon_unknown_5::WalletImpl::getAvailableBalance(WalletImpl *this,CCoinControl *coin_control)

{
  undefined1 auVar1 [16];
  bool bVar2;
  T *pTVar3;
  CCoinControl *in_RCX;
  CCoinControl *pCVar4;
  CAmount CVar5;
  long in_FS_OFFSET;
  CoinSelectionParams params;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  Result<wallet::PreSelectedInputs> res;
  FastRandomContext rng;
  undefined1 local_100 [16];
  _Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs> local_f0;
  undefined1 local_a8 [136];
  _Base_ptr local_20;
  
  pCVar4 = (CCoinControl *)&stack0xfffffffffffffea8;
  local_20 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_100._0_8_ =
       &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet;
  local_100[8] = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_100);
  bVar2 = CCoinControl::HasSelected(coin_control);
  if (bVar2) {
    FastRandomContext::FastRandomContext((FastRandomContext *)local_a8,false);
    FetchSelectedInputs((Result<wallet::PreSelectedInputs> *)&local_f0,
                        (this->m_wallet).
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        coin_control,(CoinSelectionParams *)&stack0xfffffffffffffea8);
    if (local_f0._M_index == '\x01') {
      pTVar3 = util::Result<wallet::PreSelectedInputs>::value
                         ((Result<wallet::PreSelectedInputs> *)&local_f0);
      CVar5 = pTVar3->total_amount;
      in_RCX = pCVar4;
    }
    else {
      CVar5 = 0;
      in_RCX = pCVar4;
    }
    _GLOBAL__N_1::std::__detail::__variant::
    _Variant_storage<false,_bilingual_str,_wallet::PreSelectedInputs>::~_Variant_storage(&local_f0);
    ChaCha20::~ChaCha20((ChaCha20 *)(local_a8 + 0x10));
  }
  else {
    CVar5 = 0;
  }
  if (coin_control->m_allow_other_inputs == true) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &stack0xfffffffffffffea8;
    AvailableCoins((CoinsResult *)local_a8,
                   (wallet *)
                   (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(CWallet *)coin_control,in_RCX,(optional<CFeeRate>)(auVar1 << 0x40),
                   (CoinFilterParams *)0x1);
    CVar5 = (long)(_Rb_tree_color *)local_a8._48_8_ + CVar5;
    _GLOBAL__N_1::std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)local_a8);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_100);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_20) {
    return CVar5;
  }
  __stack_chk_fail();
}

Assistant:

CAmount getAvailableBalance(const CCoinControl& coin_control) override
    {
        LOCK(m_wallet->cs_wallet);
        CAmount total_amount = 0;
        // Fetch selected coins total amount
        if (coin_control.HasSelected()) {
            FastRandomContext rng{};
            CoinSelectionParams params(rng);
            // Note: for now, swallow any error.
            if (auto res = FetchSelectedInputs(*m_wallet, coin_control, params)) {
                total_amount += res->total_amount;
            }
        }

        // And fetch the wallet available coins
        if (coin_control.m_allow_other_inputs) {
            total_amount += AvailableCoins(*m_wallet, &coin_control).GetTotalAmount();
        }

        return total_amount;
    }